

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLinOp::define
          (MLNodeLinOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory,int a_eb_limit_coarsening)

{
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  *pVVar1;
  int ncomp;
  long lVar2;
  pointer puVar3;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> _Var4;
  iMultiFab *piVar5;
  DistributionMapping *pDVar6;
  tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> tVar7;
  BoxArray *pBVar8;
  pointer puVar9;
  tuple<amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_> tVar10;
  undefined8 uVar11;
  uint uVar12;
  unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> uVar13;
  pointer piVar14;
  iMultiFab *this_00;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> _Var15;
  __uniq_ptr_data<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>,_true,_true>
  this_01;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long local_2e8;
  IntVect local_2d0;
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  *local_2c0;
  IntVect local_2b4;
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  *local_2a8;
  long local_2a0;
  IntVect local_294;
  undefined1 local_288 [104];
  BoxArray local_220;
  undefined1 local_1b8 [392];
  
  MLLinOp::define(&this->super_MLLinOp,a_geom,a_grids,a_dmap,a_info,a_factory,
                  0 < a_eb_limit_coarsening);
  if ((uint)(this->super_MLLinOp).info.hidden_direction < 3) {
    Assert_host("!hasHiddenDimension()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
                ,0x2a,"\"Nodal solver cannot have any hidden dimensions\"");
  }
  local_2a8 = &this->m_dirichlet_mask;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::resize(&local_2a8->
            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  if (0 < (this->super_MLLinOp).m_num_amr_levels) {
    piVar14 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    lVar18 = 0;
    do {
      std::
      vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::resize(&(this->m_dirichlet_mask).
                super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].
                super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ,(long)piVar14[lVar18]);
      piVar14 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (0 < piVar14[lVar18]) {
        local_2c0 = (Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     *)(lVar18 * 0x18);
        local_2e8 = 0;
        lVar17 = 0;
        lVar19 = 0;
        local_2a0 = lVar18 * 3;
        do {
          pVVar1 = local_2c0;
          local_220.m_bat._0_8_ = 0x100000001;
          local_220.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)1;
          convert((BoxArray *)local_1b8,
                  (BoxArray *)
                  (*(long *)((long)&(((this->super_MLLinOp).m_grids.
                                      super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
                                    .
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)local_2c0) +
                  lVar17),(IntVect *)&local_220);
          lVar2 = *(long *)((long)&(((this->super_MLLinOp).m_dmap.
                                     super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   ).
                                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)pVVar1);
          uVar13._M_t.
          super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
          super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
               (__uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true>
               )operator_new(0x180);
          local_288._0_8_ = (_func_int **)0x1;
          local_288._24_8_ = (pointer)0x0;
          local_288._32_8_ = (pointer)0x0;
          local_288._8_8_ = (Arena *)0x0;
          local_288._16_8_ = (pointer)0x0;
          local_2d0.vect._0_8_ = &PTR__FabFactory_0080c508;
          iMultiFab::iMultiFab
                    ((iMultiFab *)
                     uVar13._M_t.
                     super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                     .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                     (BoxArray *)local_1b8,(DistributionMapping *)(lVar2 + local_2e8),1,0,
                     (MFInfo *)local_288,(FabFactory<amrex::IArrayBox> *)&local_2d0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_288 + 0x10));
          lVar2 = local_2a0;
          puVar3 = (&(((local_2a8->
                       super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                       ).
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     ).
                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)[local_2a0];
          _Var4._M_t.
          super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
               *(tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
                &puVar3[lVar19]._M_t;
          puVar3[lVar19]._M_t =
               uVar13._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
               super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
          if ((__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
              _Var4._M_t.
              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
              super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)0x0) {
            (**(code **)(*(long *)_Var4._M_t.
                                  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                  .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8
                        ))();
          }
          BoxArray::~BoxArray((BoxArray *)local_1b8);
          uVar13._M_t.
          super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
          super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
               (&(((this->m_dirichlet_mask).
                   super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)[lVar2][lVar19]._M_t;
          FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
                    ((FabArray<amrex::IArrayBox> *)
                     uVar13._M_t.
                     super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                     .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,0,0,
                     *(int *)&((FabArrayBase *)
                              ((long)uVar13._M_t.
                                     super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                     .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl
                              + 0xcc))->_vptr_FabArrayBase,
                     (IntVect *)
                     ((long)uVar13._M_t.
                            super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                            .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 0xc0));
          lVar19 = lVar19 + 1;
          piVar14 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          lVar17 = lVar17 + 0x68;
          local_2e8 = local_2e8 + 0x10;
        } while (lVar19 < piVar14[lVar18]);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (this->super_MLLinOp).m_num_amr_levels);
  }
  makeOwnerMask((MLNodeLinOp *)local_1b8,
                *(BoxArray **)
                 &(((this->super_MLLinOp).m_grids.
                    super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                *(DistributionMapping **)
                 &(((this->super_MLLinOp).m_dmap.
                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                  ).
                  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ,*(Geometry **)
                  &(((this->super_MLLinOp).m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
  uVar11 = local_1b8._0_8_;
  local_1b8._0_8_ = (iMultiFab *)0x0;
  piVar5 = (this->m_owner_mask_top)._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
           super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
  (this->m_owner_mask_top)._M_t.
  super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = (iMultiFab *)uVar11;
  if ((piVar5 != (iMultiFab *)0x0) &&
     ((**(code **)(*(long *)&(piVar5->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8))(),
     (iMultiFab *)local_1b8._0_8_ != (iMultiFab *)0x0)) {
    (*(((FabArray<amrex::IArrayBox> *)local_1b8._0_8_)->super_FabArrayBase)._vptr_FabArrayBase[1])()
    ;
  }
  lVar18 = (long)*(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
  if (lVar18 == 1) {
    piVar5 = (this->m_owner_mask_top)._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
             super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    ncomp = (piVar5->super_FabArray<amrex::IArrayBox>).super_FabArrayBase.n_comp;
    this_00 = (iMultiFab *)operator_new(0x180);
    iMultiFab::iMultiFab(this_00,piVar5,make_alias,0,ncomp);
    piVar5 = (this->m_owner_mask_bottom)._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
             super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    (this->m_owner_mask_bottom)._M_t.
    super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
    super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = this_00;
  }
  else {
    lVar18 = lVar18 + -1;
    makeOwnerMask((MLNodeLinOp *)local_1b8,
                  (BoxArray *)
                  (lVar18 * 0x68 +
                  *(long *)&(((this->super_MLLinOp).m_grids.
                              super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>),
                  (DistributionMapping *)
                  (lVar18 * 0x10 +
                  *(long *)&(((this->super_MLLinOp).m_dmap.
                              super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ).
                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                  ),(Geometry *)
                    (lVar18 * 200 +
                    *(long *)&(((this->super_MLLinOp).m_geom.
                                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                 );
    uVar11 = local_1b8._0_8_;
    local_1b8._0_8_ = (iMultiFab *)0x0;
    piVar5 = (this->m_owner_mask_bottom)._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
             super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    (this->m_owner_mask_bottom)._M_t.
    super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
    super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = (iMultiFab *)uVar11;
    if (piVar5 == (iMultiFab *)0x0) goto LAB_0073fd6c;
    (**(code **)(*(long *)&(piVar5->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8))();
    piVar5 = (iMultiFab *)local_1b8._0_8_;
  }
  if (piVar5 != (iMultiFab *)0x0) {
    (**(code **)((long)(piVar5->super_FabArray<amrex::IArrayBox>).super_FabArrayBase.
                       _vptr_FabArrayBase + 8))();
  }
LAB_0073fd6c:
  pVVar1 = &this->m_cc_fine_mask;
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&pVVar1->
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  local_2c0 = &this->m_nd_fine_mask;
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&local_2c0->
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  std::
  vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
  ::resize(&(this->m_has_fine_bndry).
            super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  uVar12 = (this->super_MLLinOp).m_num_amr_levels;
  uVar16 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    lVar17 = 0;
    lVar18 = 0;
    do {
      if (lVar18 < (int)uVar16 + -1) {
        local_220.m_bat._0_8_ = 0x100000001;
        local_220.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)1;
        convert((BoxArray *)local_1b8,
                *(BoxArray **)
                 ((long)&(((this->super_MLLinOp).m_grids.
                           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar17),(IntVect *)&local_220);
        pDVar6 = *(DistributionMapping **)
                  ((long)&(((this->super_MLLinOp).m_dmap.
                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ).
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar17);
        _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
             operator_new(0x180);
        local_288._0_8_ = (_func_int **)0x1;
        local_288._24_8_ = (pointer)0x0;
        local_288._32_8_ = (pointer)0x0;
        local_288._8_8_ = (Arena *)0x0;
        local_288._16_8_ = (pointer)0x0;
        local_2d0.vect._0_8_ = &PTR__FabFactory_0080c508;
        iMultiFab::iMultiFab
                  ((iMultiFab *)
                   _Var15.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                   (BoxArray *)local_1b8,pDVar6,1,0,(MFInfo *)local_288,
                   (FabFactory<amrex::IArrayBox> *)&local_2d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_288 + 0x10));
        puVar3 = (local_2c0->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
              &puVar3[lVar18]._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        puVar3[lVar18]._M_t.
        super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
             _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
             .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
        if (tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
            .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
          (**(code **)(*(long *)tVar7.
                                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))
                    ();
        }
        BoxArray::~BoxArray((BoxArray *)local_1b8);
        pBVar8 = *(BoxArray **)
                  ((long)&(((this->super_MLLinOp).m_grids.
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar17);
        pDVar6 = *(DistributionMapping **)
                  ((long)&(((this->super_MLLinOp).m_dmap.
                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ).
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar17);
        _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
             operator_new(0x180);
        local_1b8._0_8_ = (iMultiFab *)0x1;
        local_1b8._24_8_ = 0;
        local_1b8._32_8_ = 0;
        local_1b8._8_8_ = 0;
        local_1b8._16_8_ = 0;
        local_288._0_8_ = &PTR__FabFactory_0080c508;
        iMultiFab::iMultiFab
                  ((iMultiFab *)
                   _Var15.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,pBVar8,pDVar6,1,1,
                   (MFInfo *)local_1b8,(FabFactory<amrex::IArrayBox> *)local_288);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b8 + 0x10));
        puVar3 = (pVVar1->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
              &puVar3[lVar18]._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        puVar3[lVar18]._M_t.
        super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
             _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
             .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
        if (tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
            .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
          (**(code **)(*(long *)tVar7.
                                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))
                    ();
        }
      }
      else {
        pBVar8 = *(BoxArray **)
                  ((long)&(((this->super_MLLinOp).m_grids.
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar17);
        pDVar6 = *(DistributionMapping **)
                  ((long)&(((this->super_MLLinOp).m_dmap.
                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ).
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar17);
        local_1b8._16_8_ = 0;
        local_1b8._24_8_ = 0;
        local_1b8._0_8_ = (iMultiFab *)0x0;
        local_1b8._8_8_ = 0;
        local_1b8._32_8_ = 0;
        _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
             operator_new(0x180);
        local_288._0_8_ = &PTR__FabFactory_0080c508;
        iMultiFab::iMultiFab
                  ((iMultiFab *)
                   _Var15.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,pBVar8,pDVar6,1,1,
                   (MFInfo *)local_1b8,(FabFactory<amrex::IArrayBox> *)local_288);
        puVar3 = (pVVar1->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
              &puVar3[lVar18]._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        puVar3[lVar18]._M_t.
        super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
             _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
             .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
        if (tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
            .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
          (**(code **)(*(long *)tVar7.
                                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))
                    ();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b8 + 0x10));
      }
      pBVar8 = *(BoxArray **)
                ((long)&(((this->super_MLLinOp).m_grids.
                          super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar17);
      pDVar6 = *(DistributionMapping **)
                ((long)&(((this->super_MLLinOp).m_dmap.
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ).
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar17);
      this_01.
      super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>.
      _M_t.
      super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
      .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
           (__uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>)
           operator_new(0x110);
      LayoutData<int>::LayoutData
                ((LayoutData<int> *)
                 this_01.
                 super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                 .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl,pBVar8,pDVar6)
      ;
      puVar9 = (this->m_has_fine_bndry).
               super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tVar10.
      super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
      .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
             *)&puVar9[lVar18]._M_t.
                super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
      ;
      puVar9[lVar18]._M_t.
      super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_> =
           this_01.
           super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
           .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl;
      if (tVar10.
          super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
          .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::LayoutData<int>_*,_false>)0x0) {
        (**(code **)(*(long *)tVar10.
                              super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                              .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl +
                    8))();
      }
      lVar18 = lVar18 + 1;
      uVar12 = (this->super_MLLinOp).m_num_amr_levels;
      uVar16 = (ulong)(int)uVar12;
      lVar17 = lVar17 + 0x18;
    } while (lVar18 < (long)uVar16);
  }
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&(this->m_norm_fine_mask).
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)(int)(uVar12 - 1));
  if (1 < (this->super_MLLinOp).m_num_amr_levels) {
    lVar17 = 0;
    lVar18 = 0;
    do {
      local_2d0.vect[0] = 1;
      local_2d0.vect[1] = 1;
      local_2d0.vect[2] = 1;
      convert((BoxArray *)local_288,
              *(BoxArray **)
               ((long)&(((this->super_MLLinOp).m_grids.
                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar17),&local_2d0);
      pDVar6 = *(DistributionMapping **)
                ((long)&(((this->super_MLLinOp).m_dmap.
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ).
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar17);
      local_294.vect[0] = 1;
      local_294.vect[1] = 1;
      local_294.vect[2] = 1;
      convert(&local_220,
              *(BoxArray **)
               ((long)&(this->super_MLLinOp).m_grids.
                       super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar17),&local_294);
      local_2b4.vect[0] =
           (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           [lVar18];
      local_2b4.vect[1] = local_2b4.vect[0];
      local_2b4.vect[2] = local_2b4.vect[0];
      makeFineMask((iMultiFab *)local_1b8,(BoxArray *)local_288,pDVar6,&local_220,&local_2b4,1,0);
      _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
           operator_new(0x180);
      FabArray<amrex::IArrayBox>::FabArray
                ((FabArray<amrex::IArrayBox> *)
                 _Var15.
                 super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                 (FabArray<amrex::IArrayBox> *)local_1b8);
      *(undefined ***)
       _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
       super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = &PTR__iMultiFab_0080d018;
      puVar3 = (this->m_norm_fine_mask).
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
            &puVar3[lVar18]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
      puVar3[lVar18]._M_t.
      super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
           _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
           _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
           super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
      if (tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
        (**(code **)(*(long *)tVar7.
                              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                              .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))()
        ;
      }
      lVar18 = lVar18 + 1;
      iMultiFab::~iMultiFab((iMultiFab *)local_1b8);
      BoxArray::~BoxArray(&local_220);
      BoxArray::~BoxArray((BoxArray *)local_288);
      lVar17 = lVar17 + 0x18;
    } while (lVar18 < (long)(this->super_MLLinOp).m_num_amr_levels + -1);
  }
  return;
}

Assistant:

void
MLNodeLinOp::define (const Vector<Geometry>& a_geom,
                     const Vector<BoxArray>& a_grids,
                     const Vector<DistributionMapping>& a_dmap,
                     const LPInfo& a_info,
                     const Vector<FabFactory<FArrayBox> const*>& a_factory,
                     int a_eb_limit_coarsening)
{
    bool eb_limit_coarsening;
    if (a_eb_limit_coarsening < 0) { // default
#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
        eb_limit_coarsening = true;
#else
        eb_limit_coarsening = false;
#endif
    } else {
        eb_limit_coarsening = a_eb_limit_coarsening;
    }

    MLLinOp::define(a_geom, a_grids, a_dmap, a_info, a_factory, eb_limit_coarsening);

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!hasHiddenDimension(),
                                     "Nodal solver cannot have any hidden dimensions");

    m_dirichlet_mask.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        m_dirichlet_mask[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_dirichlet_mask[amrlev][mglev] = std::make_unique<iMultiFab>
                (amrex::convert(m_grids[amrlev][mglev],IntVect::TheNodeVector()),
                 m_dmap[amrlev][mglev], 1, 0);
            m_dirichlet_mask[amrlev][mglev]->setVal(0); // non-Dirichlet by default
        }
    }

    m_owner_mask_top = makeOwnerMask(m_grids[0][0],
                                      m_dmap[0][0],
                                      m_geom[0][0]);
    if (m_num_mg_levels[0] == 1) {
        m_owner_mask_bottom = std::make_unique<iMultiFab>(*m_owner_mask_top, amrex::make_alias, 0,
                                                          m_owner_mask_top->nComp());
    } else {
        m_owner_mask_bottom = makeOwnerMask(m_grids[0][m_num_mg_levels[0]-1],
                                             m_dmap[0][m_num_mg_levels[0]-1],
                                             m_geom[0][m_num_mg_levels[0]-1]);
    }

    m_cc_fine_mask.resize(m_num_amr_levels);
    m_nd_fine_mask.resize(m_num_amr_levels);
    m_has_fine_bndry.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        if (amrlev < m_num_amr_levels-1)
        {
            m_nd_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (amrex::convert(m_grids[amrlev][0],IntVect::TheNodeVector()),
                 m_dmap[amrlev][0], 1, 0);
            m_cc_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (m_grids[amrlev][0], m_dmap[amrlev][0], 1, 1);
        } else {
            m_cc_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (m_grids[amrlev][0], m_dmap[amrlev][0], 1, 1, MFInfo().SetAlloc(false));
        }
        m_has_fine_bndry[amrlev] = std::make_unique<LayoutData<int> >(m_grids[amrlev][0],
                                                                      m_dmap[amrlev][0]);
    }

    m_norm_fine_mask.resize(m_num_amr_levels-1);
    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev) {
        m_norm_fine_mask[amrlev] = std::make_unique<iMultiFab>
            (makeFineMask(amrex::convert(m_grids[amrlev][0], IntVect(1)), m_dmap[amrlev][0],
                          amrex::convert(m_grids[amrlev+1][0], IntVect(1)),
                          IntVect(m_amr_ref_ratio[amrlev]), 1, 0));
    }
}